

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall
kratos::DebugInfoVisitor::visit(DebugInfoVisitor *this,ModuleInstantiationStmt *stmt)

{
  ModuleInstantiationStmt *stmt_local;
  DebugInfoVisitor *this_local;
  
  add_info(this,&stmt->super_Stmt);
  return;
}

Assistant:

void inline visit(ModuleInstantiationStmt *stmt) override { add_info(stmt); }